

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O3

ByteData * __thiscall
cfd::api::HDWalletApi::ConvertMnemonicToSeed
          (ByteData *__return_storage_ptr__,HDWalletApi *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *passphrase,bool strict_check,string *language,bool use_ideographic_space
          ,ByteData *entropy)

{
  pointer puVar1;
  pointer pcVar2;
  bool bVar3;
  CfdException *pCVar4;
  undefined3 in_register_00000081;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88 [2];
  string local_50;
  
  if (CONCAT31(in_register_00000081,strict_check) != 0) {
    if (language->_M_string_length == 0) {
      local_a8._M_dataplus._M_p = "cfdapi_hdwallet.cpp";
      local_a8._M_string_length = CONCAT44(local_a8._M_string_length._4_4_,0x3d);
      local_a8.field_2._M_allocated_capacity = (long)"CfdConvertMnemonicToSeed" + 3;
      core::logger::log<>((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,
                          "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need to set language."
                         );
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,
                 "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need to set language."
                 ,"");
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_a8);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    bVar3 = core::HDWallet::CheckValidMnemonic(mnemonic,language);
    if (!bVar3) {
      local_a8._M_dataplus._M_p = "cfdapi_hdwallet.cpp";
      local_a8._M_string_length = CONCAT44(local_a8._M_string_length._4_4_,0x48);
      local_a8.field_2._M_allocated_capacity = (long)"CfdConvertMnemonicToSeed" + 3;
      core::logger::log<>((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,
                          "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Failed to ConvertMnemonicToSeed. Mnemonic strict check error."
                 ,"");
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_a8);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  if ((entropy != (ByteData *)0x0) && (language->_M_string_length != 0)) {
    core::HDWallet::ConvertMnemonicToEntropy((ByteData *)&local_a8,mnemonic,language);
    puVar1 = (entropy->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (entropy->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_a8._M_dataplus._M_p;
    (entropy->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_a8._M_string_length;
    (entropy->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_a8.field_2._M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if ((pointer)local_a8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_88,mnemonic);
  pcVar2 = (passphrase->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + passphrase->_M_string_length);
  core::HDWallet::HDWallet((HDWallet *)&local_a8,local_88,&local_50,use_ideographic_space);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_88);
  core::HDWallet::GetSeed(__return_storage_ptr__,(HDWallet *)&local_a8);
  if ((pointer)local_a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData HDWalletApi::ConvertMnemonicToSeed(
    const std::vector<std::string>& mnemonic, const std::string& passphrase,
    bool strict_check, const std::string& language, bool use_ideographic_space,
    ByteData* entropy) const {
  if (strict_check) {
    if (language.empty()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need "
          "to set language.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need "
          "to set language.");
    }

    if (!HDWallet::CheckValidMnemonic(mnemonic, language)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
    }
  }

  try {
    // calculate entropy
    if (!language.empty() && entropy != nullptr) {
      *entropy = HDWallet::ConvertMnemonicToEntropy(mnemonic, language);
    }

    // calculate seed
    HDWallet wallet(mnemonic, passphrase, use_ideographic_space);
    return wallet.GetSeed();
  } catch (CfdException& e) {
    warn(
        CFD_LOG_SOURCE, "Failed to ConvertMnemonicToSeed. error: [{}]",
        e.what());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to ConvertMnemonicToSeed. " + std::string(e.what()));
  }
}